

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

CURLcode http2_cfilter_add(Curl_cfilter **pcf,Curl_easy *data,connectdata *conn,int sockindex)

{
  cf_h2_ctx *ctx_00;
  cf_h2_ctx *local_48;
  CURLcode local_3c;
  CURLcode result;
  cf_h2_ctx *ctx;
  Curl_cfilter *cf;
  connectdata *pcStack_20;
  int sockindex_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  Curl_cfilter **pcf_local;
  
  ctx = (cf_h2_ctx *)0x0;
  local_3c = CURLE_OUT_OF_MEMORY;
  cf._4_4_ = sockindex;
  pcStack_20 = conn;
  conn_local = (connectdata *)data;
  data_local = (Curl_easy *)pcf;
  ctx_00 = (cf_h2_ctx *)(*Curl_ccalloc)(1,0xd0);
  if ((ctx_00 != (cf_h2_ctx *)0x0) &&
     (local_3c = Curl_cf_create((Curl_cfilter **)&ctx,&Curl_cft_nghttp2,ctx_00),
     local_3c == CURLE_OK)) {
    Curl_conn_cf_add((Curl_easy *)conn_local,pcStack_20,cf._4_4_,(Curl_cfilter *)ctx);
    local_3c = CURLE_OK;
  }
  if (local_3c == CURLE_OK) {
    local_48 = ctx;
  }
  else {
    cf_h2_ctx_free(ctx_00);
    local_48 = (cf_h2_ctx *)0x0;
  }
  *(cf_h2_ctx **)data_local = local_48;
  return local_3c;
}

Assistant:

static CURLcode http2_cfilter_add(struct Curl_cfilter **pcf,
                                  struct Curl_easy *data,
                                  struct connectdata *conn,
                                  int sockindex)
{
  struct Curl_cfilter *cf = NULL;
  struct cf_h2_ctx *ctx;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  DEBUGASSERT(data->conn);
  ctx = calloc(1, sizeof(*ctx));
  if(!ctx)
    goto out;

  result = Curl_cf_create(&cf, &Curl_cft_nghttp2, ctx);
  if(result)
    goto out;

  Curl_conn_cf_add(data, conn, sockindex, cf);
  result = CURLE_OK;

out:
  if(result)
    cf_h2_ctx_free(ctx);
  *pcf = result? NULL : cf;
  return result;
}